

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_internal.c
# Opt level: O3

void bench_hmac_sha256(void *arg,int iters)

{
  size_t in_RDX;
  size_t extraout_RDX;
  uchar *key;
  secp256k1_hmac_sha256 hmac;
  secp256k1_hmac_sha256 sStack_e8;
  
  if (0 < iters) {
    key = (uchar *)((long)arg + 0x290);
    do {
      secp256k1_hmac_sha256_initialize(&sStack_e8,key,in_RDX);
      secp256k1_sha256_write(&sStack_e8.inner,key,0x20);
      secp256k1_hmac_sha256_finalize(&sStack_e8,key);
      iters = iters + -1;
      in_RDX = extraout_RDX;
    } while (iters != 0);
  }
  return;
}

Assistant:

static void bench_hmac_sha256(void* arg, int iters) {
    int i;
    bench_inv *data = (bench_inv*)arg;
    secp256k1_hmac_sha256 hmac;

    for (i = 0; i < iters; i++) {
        secp256k1_hmac_sha256_initialize(&hmac, data->data, 32);
        secp256k1_hmac_sha256_write(&hmac, data->data, 32);
        secp256k1_hmac_sha256_finalize(&hmac, data->data);
    }
}